

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QDBusMenuEvent>::copyAppend
          (QGenericArrayOps<QDBusMenuEvent> *this,QDBusMenuEvent *b,QDBusMenuEvent *e)

{
  QDBusMenuEvent *this_00;
  ulong in_RDX;
  ulong in_RSI;
  QDBusMenuEvent *in_RDI;
  QDBusMenuEvent *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QDBusMenuEvent>::begin
                        ((QArrayDataPointer<QDBusMenuEvent> *)0xb0db17);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QDBusMenuEvent::QDBusMenuEvent(this_00,in_RDI);
      local_10 = local_10 + 0x48;
      (in_RDI->m_eventId).d.ptr = (char16_t *)((long)(in_RDI->m_eventId).d.ptr + 1);
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }